

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * util::trim(string *__return_storage_ptr__,string *str)

{
  allocator<char> local_2a;
  byte local_29;
  long lStack_28;
  bool notfound;
  size_t ei;
  size_t si;
  string *str_local;
  
  local_29 = 0;
  si = (size_t)str;
  str_local = __return_storage_ptr__;
  ei = std::__cxx11::string::find_first_not_of((char *)str,0x253490);
  if (ei == 0xffffffffffffffff) {
    ei = 0;
    local_29 = 1;
  }
  lStack_28 = std::__cxx11::string::find_last_not_of((char *)si,0x253490);
  if (lStack_28 == -1) {
    if ((local_29 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_2a);
      std::allocator<char>::~allocator(&local_2a);
      return __return_storage_ptr__;
    }
    lStack_28 = std::__cxx11::string::length();
    lStack_28 = lStack_28 + -1;
  }
  lStack_28 = lStack_28 + 1;
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,si);
  return __return_storage_ptr__;
}

Assistant:

std::string trim(const std::string &str)
{
	std::size_t si, ei;
	bool notfound = false;

	si = str.find_first_not_of(" \t\n\r");
	if (si == std::string::npos)
	{
		si = 0;
		notfound = true;
	}

	ei = str.find_last_not_of(" \t\n\r");
	if (ei == std::string::npos)
	{
		if (notfound)
		{
			return "";
		}
		ei = str.length()-1;
	}
	++ei;

	return str.substr(si, ei - si);
}